

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

bool __thiscall
cmCPackArchiveGenerator::SupportsComponentInstallation(cmCPackArchiveGenerator *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CPACK_ARCHIVE_COMPONENT_INSTALL",&local_31);
  bVar1 = cmCPackGenerator::IsOn(&this->super_cmCPackGenerator,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool cmCPackArchiveGenerator::SupportsComponentInstallation() const
{
  // The Component installation support should only
  // be activated if explicitly requested by the user
  // (for backward compatibility reason)
  return IsOn("CPACK_ARCHIVE_COMPONENT_INSTALL");
}